

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool picojson::
     _parse<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (default_parse_context *ctx,
               input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  intmax_t i;
  input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_00;
  FILE *__stream;
  double f;
  char *endp;
  string num_str;
  
  __stream = (FILE *)in;
  input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::skip_ws(in);
  iVar2 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::getc(in,__stream);
  if (iVar2 == 0x22) {
    bVar1 = default_parse_context::
            parse_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(ctx,in);
    return bVar1;
  }
  if (iVar2 == 0x5b) {
    bVar1 = _parse_array<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (ctx,in);
    return bVar1;
  }
  if (iVar2 == 0x66) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&num_str,"alse",(allocator<char> *)&endp);
    bVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::match(in,&num_str);
    if (!bVar1) {
LAB_0010704f:
      std::__cxx11::string::~string((string *)&num_str);
      return false;
    }
    bVar1 = default_parse_context::set_bool(ctx,false);
LAB_00107033:
    std::__cxx11::string::~string((string *)&num_str);
    if (bVar1 == false) {
      return false;
    }
    return true;
  }
  if (iVar2 == 0x7b) {
    bVar1 = _parse_object<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (ctx,in);
    return bVar1;
  }
  if (iVar2 == 0x74) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&num_str,"rue",(allocator<char> *)&endp);
    bVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::match(in,&num_str);
    if (!bVar1) goto LAB_0010704f;
    bVar1 = default_parse_context::set_bool(ctx,true);
    goto LAB_00107033;
  }
  if (iVar2 == 0x6e) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&num_str,"ull",(allocator<char> *)&endp);
    bVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::match(in,&num_str);
    if (!bVar1) goto LAB_0010704f;
    bVar1 = default_parse_context::set_null(ctx);
    goto LAB_00107033;
  }
  if (iVar2 != 0x2d && 9 < iVar2 - 0x30U) {
    in->consumed_ = false;
    return false;
  }
  in->consumed_ = false;
  _parse_number<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (&num_str,(picojson *)in,in_00);
  if (num_str._M_string_length != 0) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    i = strtoimax(num_str._M_dataplus._M_p,&endp,10);
    if ((*piVar3 == 0) && (endp == num_str._M_dataplus._M_p + num_str._M_string_length)) {
      bVar1 = true;
      default_parse_context::set_int64(ctx,i);
      goto LAB_00107151;
    }
    f = strtod(num_str._M_dataplus._M_p,&endp);
    if (endp == num_str._M_dataplus._M_p + num_str._M_string_length) {
      bVar1 = true;
      default_parse_context::set_number(ctx,f);
      goto LAB_00107151;
    }
  }
  bVar1 = false;
LAB_00107151:
  std::__cxx11::string::~string((string *)&num_str);
  return bVar1;
}

Assistant:

inline bool _parse(Context &ctx, input<Iter> &in) {
  in.skip_ws();
  int ch = in.getc();
  switch (ch) {
#define IS(ch, text, op)                                                                                                           \
  case ch:                                                                                                                         \
    if (in.match(text) && op) {                                                                                                    \
      return true;                                                                                                                 \
    } else {                                                                                                                       \
      return false;                                                                                                                \
    }
    IS('n', "ull", ctx.set_null());
    IS('f', "alse", ctx.set_bool(false));
    IS('t', "rue", ctx.set_bool(true));
#undef IS
  case '"':
    return ctx.parse_string(in);
  case '[':
    return _parse_array(ctx, in);
  case '{':
    return _parse_object(ctx, in);
  default:
    if (('0' <= ch && ch <= '9') || ch == '-') {
      double f;
      char *endp;
      in.ungetc();
      std::string num_str(_parse_number(in));
      if (num_str.empty()) {
        return false;
      }
#ifdef PICOJSON_USE_INT64
      {
        errno = 0;
        intmax_t ival = strtoimax(num_str.c_str(), &endp, 10);
        if (errno == 0 && std::numeric_limits<int64_t>::min() <= ival && ival <= std::numeric_limits<int64_t>::max() &&
            endp == num_str.c_str() + num_str.size()) {
          ctx.set_int64(ival);
          return true;
        }
      }
#endif
      f = strtod(num_str.c_str(), &endp);
      if (endp == num_str.c_str() + num_str.size()) {
        ctx.set_number(f);
        return true;
      }
      return false;
    }
    break;
  }
  in.ungetc();
  return false;
}